

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O2

double __thiscall RandomGen::rand_skewGauss(RandomGen *this,double xi,double omega,double alpha)

{
  RandomGen *pRVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 local_80;
  
  dVar7 = alpha / SQRT(alpha * alpha + 1.0);
  dVar3 = dVar7 * 0.7978845608028654;
  dVar4 = pow(dVar3,3.0);
  dVar7 = pow(((dVar7 + dVar7) * dVar7) / -3.141592653589793 + 1.0,1.5);
  dVar6 = 1.0 - dVar3 * dVar3;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
    dVar5 = dVar6;
  }
  else {
    dVar5 = SQRT(dVar6);
  }
  dVar4 = (dVar4 / dVar7) * 0.42920367320510344;
  if (0.0 < alpha) {
    dVar7 = exp(-6.283185307179586 / alpha);
    dVar6 = dVar7 * -0.5 + dVar4 * -0.5 * dVar5 + dVar3;
  }
  if (alpha < 0.0) {
    dVar7 = exp(6.283185307179586 / alpha);
    dVar6 = dVar7 * 0.5 + dVar4 * -0.5 * dVar5 + dVar3;
  }
  dVar3 = (dVar6 * omega + xi) - xi;
  dVar4 = dVar3 / omega;
  local_80 = exp(dVar4 * dVar4 * -0.5);
  local_80 = local_80 / (omega * 2.5066282746310007);
  dVar3 = erfc(((dVar3 * alpha) / omega) / -1.414213562373095);
  dVar3 = dVar3 * local_80;
  dVar4 = omega * -6.0 + xi;
  bVar2 = false;
  while (!bVar2) {
    pRVar1 = rndm();
    dVar7 = rand_uniform(pRVar1);
    local_80 = dVar7 * ((omega * 6.0 + xi) - dVar4) + dVar4;
    pRVar1 = rndm();
    dVar7 = rand_uniform(pRVar1);
    dVar6 = (local_80 - xi) / omega;
    dVar6 = exp(dVar6 * dVar6 * -0.5);
    dVar5 = erfc((((local_80 - xi) * -alpha) / omega) / 1.414213562373095);
    if (dVar7 * dVar3 <= dVar5 * (dVar6 / (omega * 2.5066282746310007))) {
      bVar2 = true;
    }
  }
  return local_80;
}

Assistant:

double RandomGen::rand_skewGauss(double xi, double omega, double alpha) {
  double delta = alpha / sqrt(1 + alpha * alpha);
  double gamma1 = four_minus_PI_div_2 *
                  (pow(delta * sqrt2_div_PI, 3.) /
                   pow(1 - 2. * delta * delta / M_PI, 1.5));  // skewness
  double muz = delta * sqrt2_div_PI;
  double sigz = sqrt(1. - muz * muz);
  double m_o;
  if (alpha > 0.) {
    m_o = muz - 0.5 * gamma1 * sigz - 0.5 * exp(-two_PI / alpha);
  }
  if (alpha < 0.) {
    m_o = muz - 0.5 * gamma1 * sigz + 0.5 * exp(two_PI / alpha);
  }
  double mode = xi + omega * m_o;
  // the height should be the value of the PDF at the mode
  double height = exp(-0.5 * (pow((mode - xi) / omega, 2.))) /
                  (sqrt2_PI * omega) *
                  erfc(-1. * alpha * (mode - xi) / omega / sqrt2);
  bool gotValue = false;
  double minX = xi - 6. * omega;
  double maxX =
      xi + 6. * omega;  // +/- 6sigma should be essentially +/- infinity
                        //  can increase these for even better accuracy, at the
                        //  cost of speed
  double testX, testY, testProb;
  while (gotValue == false) {
    testX = minX + (maxX - minX) * RandomGen::rndm()->rand_uniform();
    testY = height *
            RandomGen::rndm()->rand_uniform();  // between 0 and peak height
    // calculate the value of the skewGauss PDF at the test x-value
    testProb = exp(-0.5 * (pow((testX - xi) / omega, 2.))) /
               (sqrt2_PI * omega) *
               erfc(-1. * alpha * (testX - xi) / omega / sqrt2);
    if (testProb >= testY) {
      gotValue = true;
    }
  }
  return testX;
}